

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O1

void __thiscall
cmUuid::CreateHashInput
          (cmUuid *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *uuidNamespace,
          string *name,vector<unsigned_char,_std::allocator<unsigned_char>_> *output)

{
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(output,uuidNamespace);
  if (name->_M_string_length != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (output,(size_type)
                      ((output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish +
                      (name->_M_string_length -
                      (long)(output->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start)));
    memcpy((uuidNamespace->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_finish +
           ((long)(output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start -
           (long)(uuidNamespace->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start),(name->_M_dataplus)._M_p,
           name->_M_string_length);
    return;
  }
  return;
}

Assistant:

void cmUuid::CreateHashInput(std::vector<unsigned char> const& uuidNamespace,
                             std::string const& name,
                             std::vector<unsigned char>& output) const
{
  output = uuidNamespace;

  if (!name.empty()) {
    output.resize(output.size() + name.size());

    memcpy(&output[0] + uuidNamespace.size(), name.c_str(), name.size());
  }
}